

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<true,_true,_false>::pack_tail(DaTrie<true,_true,_false> *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pBVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  char *__s;
  Query query;
  vector<char,_std::allocator<char>_> local_68;
  Query local_48;
  
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve
            (&local_68,
             (long)(this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)((this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + this->tail_emps_));
  pcVar1 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  pcVar2 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = pcVar2;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = pcVar3;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar1;
  if ((int)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pBVar4) >> 3) != 0) {
    uVar6 = 0;
    do {
      uVar7 = SUB84(pBVar4[uVar6],0);
      if (((int)uVar7 < 0) &&
         ((uVar6 == 0 ||
          (uVar6 != ((uint)*(undefined8 *)
                            (&pBVar4->field_0x0 + ((ulong)pBVar4[uVar6] >> 0x1d & 0x3fffffff8)) &
                    0x7fffffff))))) {
        __s = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + (uVar7 & 0x7fffffff);
        local_48.pos_ = 0;
        local_48.value_ = 0x7fffffff;
        local_48.node_pos_ = 0;
        local_48.is_finished_ = false;
        local_48.key_ = __s;
        sVar5 = strlen(__s);
        local_48.value_ = *(uint32_t *)(__s + ((int)sVar5 + 1));
        local_48.node_pos_ = (uint32_t)uVar6;
        insert_tail_(this,&local_48);
      }
      uVar6 = uVar6 + 1;
      pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < ((ulong)((long)(this->bc_).
                                    super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pBVar4) >> 3 &
                     0xffffffff));
  }
  this->tail_emps_ = 0;
  if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pack_tail() {
    assert(!Prefix);

    std::vector<char> tail;
    tail.reserve(tail_.size() - tail_emps_);

    tail_.swap(tail);

    for (uint32_t node_pos = 0; node_pos < bc_size(); ++node_pos) {
      if (bc_[node_pos].is_leaf() && !is_terminal_(node_pos)) {
        auto _tail = tail.data() + bc_[node_pos].value();
        Query query(_tail);
        query.set_value(utils::extract_value(_tail + utils::length(_tail)));
        query.set_node_pos(node_pos);
        insert_tail_(query);
      }
    }
    tail_emps_ = 0;
  }